

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O3

int __thiscall FNodeBuilder::Heuristic(FNodeBuilder *this,node_t *node,DWORD set,bool honorNoSplit)

{
  int *piVar1;
  FPrivVert *pFVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  FPrivSeg *seg;
  ulong uVar13;
  TArray<int,_int> *pTVar14;
  uint *puVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  int sidev [2];
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  TArray<int,_int> *local_70;
  uint *local_68;
  TArray<int,_int> *local_60;
  uint *local_58;
  FNodeBuilder *local_50;
  ulong local_48;
  node_t *local_40;
  int local_38;
  int local_34;
  
  local_78 = 0;
  local_80 = 0;
  local_88 = 0;
  local_58 = &(this->Touched).Count;
  if ((this->Touched).Count != 0) {
    *local_58 = 0;
  }
  local_68 = &(this->Colinear).Count;
  if ((this->Colinear).Count != 0) {
    *local_68 = 0;
  }
  if (set != 0xffffffff) {
    local_60 = &this->Touched;
    local_70 = &this->Colinear;
    uVar9 = 0;
    iVar10 = 1000000;
    local_48 = 0;
    local_50 = this;
    local_40 = node;
    do {
      seg = (this->Segs).Array + set;
      uVar13 = 1;
      if (this->HackSeg == set) {
LAB_004f8806:
        iVar6 = seg->loopnum;
        if ((iVar6 != 0 && honorNoSplit) && (local_34 == 0 || local_38 == 0)) {
          if (local_34 == 0 && local_38 == 0) {
            uVar4 = *local_68;
            pTVar14 = local_70;
            puVar15 = local_68;
            if ((ulong)uVar4 == 0) {
              uVar8 = 0;
LAB_004f8a59:
              uVar7 = (uint)uVar8;
              goto LAB_004f8a63;
            }
            uVar8 = 0;
            do {
              if (local_70->Array[uVar8] == iVar6) goto LAB_004f8a59;
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
          }
          else {
            uVar4 = *local_58;
            pTVar14 = local_60;
            puVar15 = local_58;
            if ((ulong)uVar4 == 0) {
              uVar8 = 0;
LAB_004f8a4b:
              uVar7 = (uint)uVar8;
LAB_004f8a63:
              if (uVar7 != uVar4) goto LAB_004f8a8a;
            }
            else {
              uVar8 = 0;
              do {
                if (local_60->Array[uVar8] == iVar6) goto LAB_004f8a4b;
                uVar8 = uVar8 + 1;
              } while (uVar4 != uVar8);
            }
          }
          TArray<int,_int>::Grow(pTVar14,1);
          pTVar14->Array[*puVar15] = seg->loopnum;
          *puVar15 = *puVar15 + 1;
          this = local_50;
        }
LAB_004f8a8a:
        piVar1 = (int *)((long)&local_78 + uVar13 * 4);
        *piVar1 = *piVar1 + 1;
        if (seg->linedef == -1) {
          iVar10 = iVar10 + 2;
          node = local_40;
        }
        else {
          piVar1 = (int *)((long)&local_80 + uVar13 * 4);
          *piVar1 = *piVar1 + 1;
          if (seg->frontsector == seg->backsector) {
            piVar1 = (int *)((long)&local_88 + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
          }
          iVar10 = iVar10 + 8;
          node = local_40;
        }
      }
      else {
        pFVar2 = (this->Vertices).Array;
        uVar4 = ClassifyLine2(node,&pFVar2[seg->v1].super_FSimpleVert,
                              &pFVar2[seg->v2].super_FSimpleVert,&local_38);
        uVar13 = (ulong)uVar4;
        this = local_50;
        if (uVar4 < 2) goto LAB_004f8806;
        bVar16 = seg->loopnum != 0;
        if (honorNoSplit && bVar16) {
          return -1;
        }
        dVar17 = InterceptVector(local_50,node,seg);
        if ((dVar17 < 0.001) || (0.999 < dVar17)) {
          pFVar2 = (local_50->Vertices).Array;
          dVar22 = (double)pFVar2[seg->v1].super_FSimpleVert.x;
          dVar21 = (double)pFVar2[seg->v1].super_FSimpleVert.y;
          dVar20 = (double)pFVar2[seg->v2].super_FSimpleVert.x;
          dVar18 = (dVar20 - dVar22) * dVar17 + dVar22;
          dVar19 = (double)pFVar2[seg->v2].super_FSimpleVert.y;
          dVar3 = (dVar19 - dVar21) * dVar17 + dVar21;
          if ((ABS(dVar18 - dVar22) < 7.0) && (ABS(dVar3 - dVar21) < 7.0)) {
            return -1;
          }
          if ((ABS(dVar18 - dVar20) < 7.0) && (ABS(dVar3 - dVar19) < 7.0)) {
            return -1;
          }
          iVar10 = iVar10 - (int)(1.0 / (double)(~-(ulong)(0.999 < dVar17) & (ulong)dVar17 |
                                                (ulong)(1.0 - dVar17) & -(ulong)(0.999 < dVar17)));
          if (iVar10 < 2) {
            iVar10 = 1;
          }
        }
        local_48 = CONCAT71((int7)(local_48 >> 8),(byte)local_48 | bVar16);
        local_78 = CONCAT44((int)((ulong)local_78 >> 0x20) + 1,(int)local_78 + 1);
        this = local_50;
        if ((seg->linedef != -1) &&
           (local_80 = CONCAT44((int)((ulong)local_80 >> 0x20) + 1,(int)local_80 + 1),
           seg->frontsector == seg->backsector)) {
          local_88 = CONCAT44((int)((ulong)local_88 >> 0x20) + 1,(int)local_88 + 1);
        }
      }
      uVar9 = uVar9 + 1;
      set = seg->next;
    } while (set != 0xffffffff);
    if (local_78._4_4_ != 0 && (int)local_78 != 0) {
      if (local_80._4_4_ == 0 || (int)local_80 == 0) {
        return -1;
      }
      if (honorNoSplit) {
        if ((int)local_88 == (int)local_80) {
          return -1;
        }
        if (local_88._4_4_ == local_80._4_4_) {
          return -1;
        }
      }
      uVar13 = (ulong)*local_58;
      uVar8 = (ulong)*local_68;
      if (uVar13 != 0 && uVar8 == 0) {
        return -1;
      }
      if (uVar13 != 0) {
        uVar11 = 0;
        do {
          uVar12 = 0;
          if (uVar8 != 0) {
            uVar12 = 0;
            while (local_60->Array[uVar11] != local_70->Array[uVar12]) {
              uVar12 = uVar12 + 1;
              if (uVar8 == uVar12) {
                return -1;
              }
            }
          }
          if ((uint)uVar12 == *local_68) {
            return -1;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar13);
      }
      if ((node->dx == 0) || (node->dy == 0)) {
        if ((local_48 & 1) == 0) {
          iVar10 = iVar10 + (uVar9 >> 4);
        }
        else {
          iVar10 = iVar10 + uVar9 * 8;
        }
      }
      iVar5 = (int)local_78 - local_78._4_4_;
      iVar6 = -iVar5;
      if (iVar5 < 1) {
        iVar6 = iVar5;
      }
      return iVar10 + local_78._4_4_ + (int)local_78 + iVar6;
    }
  }
  return 0;
}

Assistant:

int FNodeBuilder::Heuristic (node_t &node, DWORD set, bool honorNoSplit)
{
	// Set the initial score above 0 so that near vertex anti-weighting is less likely to produce a negative score.
	int score = 1000000;
	int segsInSet = 0;
	int counts[2] = { 0, 0 };
	int realSegs[2] = { 0, 0 };
	int specialSegs[2] = { 0, 0 };
	DWORD i = set;
	int sidev[2];
	int side;
	bool splitter = false;
	unsigned int max, m2, p, q;
	double frac;

	Touched.Clear ();
	Colinear.Clear ();

	while (i != DWORD_MAX)
	{
		const FPrivSeg *test = &Segs[i];

		if (HackSeg == i)
		{
			side = 1;
		}
		else
		{
			side = ClassifyLine (node, &Vertices[test->v1], &Vertices[test->v2], sidev);
		}
		switch (side)
		{
		case 0:	// Seg is on only one side of the partition
		case 1:
			// If we don't split this line, but it abuts the splitter, also reject it.
			// The "right" thing to do in this case is to only reject it if there is
			// another nosplit seg from the same sector at this vertex. Note that a line
			// that lies exactly on top of the splitter is okay.
			if (test->loopnum && honorNoSplit && (sidev[0] == 0 || sidev[1] == 0))
			{
				if ((sidev[0] | sidev[1]) != 0)
				{
					max = Touched.Size();
					for (p = 0; p < max; ++p)
					{
						if (Touched[p] == test->loopnum)
						{
							break;
						}
					}
					if (p == max)
					{
						Touched.Push (test->loopnum);
					}
				}
				else
				{
					max = Colinear.Size();
					for (p = 0; p < max; ++p)
					{
						if (Colinear[p] == test->loopnum)
						{
							break;
						}
					}
					if (p == max)
					{
						Colinear.Push (test->loopnum);
					}
				}
			}

			counts[side]++;
			if (test->linedef != -1)
			{
				realSegs[side]++;
				if (test->frontsector == test->backsector)
				{
					specialSegs[side]++;
				}
				// Add some weight to the score for unsplit lines
				score += SplitCost;	
			}
			else
			{
				// Minisegs don't count quite as much for nosplitting
				score += SplitCost / 4;
			}
			break;

		default:	// Seg is cut by the partition
			// If we are not allowed to split this seg, reject this splitter
			if (test->loopnum)
			{
				if (honorNoSplit)
				{
					D(Printf (PRINT_LOG, "Splits seg %d\n", i));
					return -1;
				}
				else
				{
					splitter = true;
				}
			}

			// Splitters that are too close to a vertex are bad.
			frac = InterceptVector (node, *test);
			if (frac < 0.001 || frac > 0.999)
			{
				FPrivVert *v1 = &Vertices[test->v1];
				FPrivVert *v2 = &Vertices[test->v2];
				double x = v1->x, y = v1->y;
				x += frac * (v2->x - x);
				y += frac * (v2->y - y);
				if (fabs(x - v1->x) < VERTEX_EPSILON+1 && fabs(y - v1->y) < VERTEX_EPSILON+1)
				{
					D(Printf("Splitter will produce same start vertex as seg %d\n", i));
					return -1;
				}
				if (fabs(x - v2->x) < VERTEX_EPSILON+1 && fabs(y - v2->y) < VERTEX_EPSILON+1)
				{
					D(Printf("Splitter will produce same end vertex as seg %d\n", i));
					return -1;
				}
				if (frac > 0.999)
				{
					frac = 1 - frac;
				}
				int penalty = int(1 / frac);
				score = MAX(score - penalty, 1);
				D(Printf ("Penalized splitter by %d for being near endpt of seg %d (%f).\n", penalty, i, frac));
			}

			counts[0]++;
			counts[1]++;
			if (test->linedef != -1)
			{
				realSegs[0]++;
				realSegs[1]++;
				if (test->frontsector == test->backsector)
				{
					specialSegs[0]++;
					specialSegs[1]++;
				}
			}
			break;
		}

		segsInSet++;
		i = test->next;
	}

	// If this line is outside all the others, return a special score
	if (counts[0] == 0 || counts[1] == 0)
	{
		return 0;
	}

	// A splitter must have at least one real seg on each side.
	// Otherwise, a subsector could be left without any way to easily
	// determine which sector it lies inside.
	if (realSegs[0] == 0 || realSegs[1] == 0)
	{
		D(Printf (PRINT_LOG, "Leaves a side with only mini segs\n"));
		return -1;
	}

	// Try to avoid splits that leave only "special" segs, so that the generated
	// subsectors have a better chance of choosing the correct sector. This situation
	// is not neccesarily bad, just undesirable.
	if (honorNoSplit && (specialSegs[0] == realSegs[0] || specialSegs[1] == realSegs[1]))
	{
		D(Printf (PRINT_LOG, "Leaves a side with only special segs\n"));
		return -1;
	}

	// If this splitter intersects any vertices of segs that should not be split,
	// check if it is also colinear with another seg from the same sector. If it
	// is, the splitter is okay. If not, it should be rejected. Why? Assuming that
	// polyobject containers are convex (which they should be), a splitter that
	// is colinear with one of the sector's segs and crosses the vertex of another
	// seg of that sector must be crossing the container's corner and does not
	// actually split the container.

	max = Touched.Size ();
	m2 = Colinear.Size ();

	// If honorNoSplit is false, then both these lists will be empty.

	// If the splitter touches some vertices without being colinear to any, we
	// can skip further checks and reject this right away.
	if (m2 == 0 && max > 0)
	{
		return -1;
	}

	for (p = 0; p < max; ++p)
	{
		int look = Touched[p];
		for (q = 0; q < m2; ++q)
		{
			if (look == Colinear[q])
			{
				break;
			}
		}
		if (q == m2)
		{ // Not a good one
			return -1;
		}
	}

	// Doom maps are primarily axis-aligned lines, so it's usually a good
	// idea to prefer axis-aligned splitters over diagonal ones. Doom originally
	// had special-casing for orthogonal lines, so they performed better. ZDoom
	// does not care about the line's direction, so this is merely a choice to
	// try and improve the final tree.

	if ((node.dx == 0) || (node.dy == 0))
	{
		// If we have to split a seg we would prefer to keep unsplit, give
		// extra precedence to orthogonal lines so that the polyobjects
		// outside the entrance to MAP06 in Hexen MAP02 display properly.
		if (splitter)
		{
			score += segsInSet*8;
		}
		else
		{
			score += segsInSet/AAPreference;
		}
	}

	score += (counts[0] + counts[1]) - abs(counts[0] - counts[1]);

	return score;
}